

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

NanoVDBMedium *
pbrt::NanoVDBMedium::Create
          (ParameterDictionary *parameters,Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  Allocator alloc_00;
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  NanoVDBMedium *pNVar4;
  undefined8 in_RCX;
  ParameterDictionary *in_RDI;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float sigmaScale;
  Spectrum sigma_s;
  Spectrum sigma_a;
  Float g;
  Float temperatureScale;
  Float temperatureOffset;
  Float LeScale;
  string temperaturename;
  GridHandle<pbrt::NanoVDBBuffer> temperatureGrid;
  string gridname;
  GridHandle<pbrt::NanoVDBBuffer> densityGrid;
  string filename;
  string *in_stack_fffffffffffffac8;
  ParameterDictionary *in_stack_fffffffffffffad0;
  GridHandle<pbrt::NanoVDBBuffer> *this;
  float *in_stack_fffffffffffffad8;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb18;
  Spectrum *args_2;
  string *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  ParameterDictionary *this_00;
  undefined8 in_stack_fffffffffffffb38;
  SpectrumType SVar8;
  Spectrum *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  ParameterDictionary *this_01;
  Allocator AVar9;
  undefined4 in_stack_fffffffffffffb60;
  ParameterDictionary *args_6;
  allocator<char> *args_7;
  undefined4 in_stack_fffffffffffffb78;
  ParameterDictionary *args_9;
  polymorphic_allocator<std::byte> *args_10;
  FileLoc *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined8 local_3c1;
  Float local_3a0;
  undefined4 local_39c;
  undefined8 local_390;
  allocator<char> local_379;
  string local_378 [32];
  TaggedPointer local_358 [12];
  undefined4 local_34c;
  undefined8 local_340;
  undefined8 local_329;
  TaggedPointer local_308 [15];
  allocator<char> local_2f9;
  string local_2f8 [32];
  Float local_2d8;
  undefined8 local_2d1;
  Float local_2b0;
  allocator<char> local_2a9;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [32];
  Float local_260;
  allocator<char> local_259;
  string local_258 [36];
  Float local_234;
  undefined8 local_230;
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  GridHandle<pbrt::NanoVDBBuffer> local_198;
  undefined8 local_178;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [71];
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [48];
  ParameterDictionary *local_10;
  undefined8 local_8;
  
  SVar8 = (SpectrumType)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  local_10 = in_RDI;
  local_8 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  ResolveFilename((string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    ErrorExit((FileLoc *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  }
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  local_178 = local_8;
  AVar9.memoryResource._4_4_ = in_stack_fffffffffffffbbc;
  AVar9.memoryResource._0_4_ = in_stack_fffffffffffffbb8;
  readGrid<pbrt::NanoVDBBuffer>
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,AVar9);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::operator=
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffad0,
             (GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffac8);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffad0);
  bVar1 = nanovdb::GridHandleBase::operator_cast_to_bool((GridHandleBase *)0x9109d9);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string&>
              ((FileLoc *)in_stack_fffffffffffffb10,
               (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
  }
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  local_230 = local_8;
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffbbc;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffbb8;
  readGrid<pbrt::NanoVDBBuffer>
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,alloc_00)
  ;
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::operator=
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffad0,
             (GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffac8);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0.0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  local_234 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  ParameterDictionary::GetOneFloat(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0.0);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0.0);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  args_10 = (polymorphic_allocator<std::byte> *)&local_2d1;
  args_9 = local_10;
  local_260 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0.0);
  std::__cxx11::string::~string((string *)((long)&local_2d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  args_7 = &local_2f9;
  args_6 = local_10;
  local_2b0 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0.0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  AVar9.memoryResource = (memory_resource *)&local_329;
  this_01 = local_10;
  local_2d8 = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_340 = local_8;
  ParameterDictionary::GetOneSpectrum
            (this_01,(string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             in_stack_fffffffffffffb40,SVar8,AVar9);
  std::__cxx11::string::~string((string *)((long)&local_329 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  uVar2 = pbrt::TaggedPointer::operator_cast_to_bool(local_308);
  if (!(bool)uVar2) {
    local_34c = 0x3f800000;
    in_stack_fffffffffffffb40 =
         (Spectrum *)
         pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                   (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffffad0,(ConstantSpectrum *)in_stack_fffffffffffffac8);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffad0,(Spectrum *)in_stack_fffffffffffffac8)
    ;
  }
  SVar8 = (SpectrumType)((ulong)&local_379 >> 0x20);
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_390 = local_8;
  ParameterDictionary::GetOneSpectrum
            (this_01,(string *)CONCAT17(uVar2,in_stack_fffffffffffffb48),in_stack_fffffffffffffb40,
             SVar8,AVar9);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  uVar2 = pbrt::TaggedPointer::operator_cast_to_bool(local_358);
  if (!(bool)uVar2) {
    local_39c = 0x3f800000;
    in_stack_fffffffffffffb20 =
         (string *)
         pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                   (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffffad0,(ConstantSpectrum *)in_stack_fffffffffffffac8);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffad0,(Spectrum *)in_stack_fffffffffffffac8)
    ;
  }
  args_2 = (Spectrum *)&local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (allocator<char> *)in_stack_fffffffffffffb00);
  FVar7 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0.0);
  std::__cxx11::string::~string((string *)((long)&local_3c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  this = &local_198;
  local_3a0 = FVar7;
  pNVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::NanoVDBMedium,pbrt::Transform_const&,pbrt::Spectrum&,pbrt::Spectrum&,float&,float&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this_00,
                      (Transform *)CONCAT17(uVar2,in_stack_fffffffffffffb28),
                      (Spectrum *)in_stack_fffffffffffffb20,args_2,(float *)local_10,
                      (float *)CONCAT44(FVar7,in_stack_fffffffffffffb08),
                      (GridHandle<pbrt::NanoVDBBuffer> *)CONCAT44(FVar6,in_stack_fffffffffffffb60),
                      (GridHandle<pbrt::NanoVDBBuffer> *)args_6,(float *)args_7,
                      (float *)CONCAT44(FVar5,in_stack_fffffffffffffb78),(float *)args_9,args_10);
  std::__cxx11::string::~string(local_1b8);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(this);
  std::__cxx11::string::~string(local_100);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(this);
  std::__cxx11::string::~string(local_40);
  return pNVar4;
}

Assistant:

NanoVDBMedium *NanoVDBMedium::Create(const ParameterDictionary &parameters,
                                     const Transform &renderFromMedium,
                                     const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    if (filename.empty())
        ErrorExit(loc, "Must supply \"filename\" to \"nanovdb\" medium.");

    nanovdb::GridHandle<NanoVDBBuffer> densityGrid;
    std::string gridname = parameters.GetOneString("gridname", "density");
    densityGrid = readGrid<NanoVDBBuffer>(filename, gridname, loc, alloc);
    if (!densityGrid)
        ErrorExit(loc, "%s: didn't find \"density\" grid.", filename);

    nanovdb::GridHandle<NanoVDBBuffer> temperatureGrid;
    std::string temperaturename =
        parameters.GetOneString("temperaturename", "temperature");
    temperatureGrid = readGrid<NanoVDBBuffer>(filename, temperaturename, loc, alloc);

    Float LeScale = parameters.GetOneFloat("Lescale", 1.f);
    Float temperatureOffset = parameters.GetOneFloat("temperatureoffset",
                                                     parameters.GetOneFloat("temperaturecutoff", 0.f));
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    Float g = parameters.GetOneFloat("g", 0.);
    Spectrum sigma_a =
        parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded, alloc);
    if (!sigma_a)
        sigma_a = alloc.new_object<ConstantSpectrum>(1.f);
    Spectrum sigma_s =
        parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded, alloc);
    if (!sigma_s)
        sigma_s = alloc.new_object<ConstantSpectrum>(1.f);
    Float sigmaScale = parameters.GetOneFloat("scale", 1.f);

    return alloc.new_object<NanoVDBMedium>(
        renderFromMedium, sigma_a, sigma_s, sigmaScale, g, std::move(densityGrid),
        std::move(temperatureGrid), LeScale, temperatureOffset, temperatureScale, alloc);
}